

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBuffer.h
# Opt level: O1

void __thiscall
aeron::concurrent::AtomicBuffer::AtomicBuffer(AtomicBuffer *this,uint8_t *buffer,size_t length)

{
  SourcedException *this_00;
  char *pcVar1;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  this->_vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_00163978;
  this->m_buffer = buffer;
  this->m_length = (length_t)length;
  if ((length & 0xffffffff80000000) != 0) {
    this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
    util::strPrintf_abi_cxx11_(&local_40,"length out of bounds[%p]: length=%lld",this,length);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "aeron::concurrent::AtomicBuffer::AtomicBuffer(std::uint8_t *, size_t)","");
    pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/AtomicBuffer.h"
                              );
    std::__cxx11::string::string((string *)&local_60,pcVar1,&local_81);
    util::SourcedException::SourcedException(this_00,&local_40,&local_80,&local_60,0x3d);
    *(undefined ***)this_00 = &PTR__SourcedException_00163a30;
    __cxa_throw(this_00,&util::OutOfBoundsException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  return;
}

Assistant:

AtomicBuffer(std::uint8_t *buffer, size_t length) :
        m_buffer(buffer),
        m_length(static_cast<util::index_t>(length))
    {
#if !defined(DISABLE_BOUNDS_CHECKS)
        if (AERON_COND_EXPECT(length > std::numeric_limits<util::index_t>::max(), true))
        {
            throw aeron::util::OutOfBoundsException(
                aeron::util::strPrintf("length out of bounds[%p]: length=%lld", this, static_cast<long long>(length)),
                SOURCEINFO);
        }
#endif
    }